

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O0

void __thiscall cmQtAutoMocUic::cmQtAutoMocUic(cmQtAutoMocUic *this)

{
  cmQtAutoMocUic *this_local;
  
  cmQtAutoGenerator::cmQtAutoGenerator(&this->super_cmQtAutoGenerator);
  (this->super_cmQtAutoGenerator)._vptr_cmQtAutoGenerator =
       (_func_int **)&PTR__cmQtAutoMocUic_00ac3a60;
  cmQtAutoGenerator::Logger::Logger(&this->Logger_);
  BaseSettingsT::BaseSettingsT(&this->BaseConst_);
  BaseEvalT::BaseEvalT(&this->BaseEval_);
  MocSettingsT::MocSettingsT(&this->MocConst_);
  MocEvalT::MocEvalT(&this->MocEval_);
  UicSettingsT::UicSettingsT(&this->UicConst_);
  UicEvalT::UicEvalT(&this->UicEval_);
  std::__cxx11::string::string((string *)&this->SettingsFile_);
  std::__cxx11::string::string((string *)&this->SettingsStringMoc_);
  std::__cxx11::string::string((string *)&this->SettingsStringUic_);
  std::atomic<bool>::atomic(&this->JobError_,false);
  cmWorkerPool::cmWorkerPool(&this->WorkerPool_);
  return;
}

Assistant:

cmQtAutoMocUic::cmQtAutoMocUic() = default;